

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.cc
# Opt level: O3

bool MathUtil::RealRootsForCubic
               (longdouble a,longdouble b,longdouble c,longdouble *r1,longdouble *r2,longdouble *r3)

{
  longdouble lVar1;
  bool bVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  double dVar9;
  double dVar10;
  
  lVar3 = a * a;
  lVar8 = b * (longdouble)3.0;
  lVar4 = (lVar3 - lVar8) / (longdouble)9.0;
  lVar5 = a / (longdouble)3.0;
  lVar3 = (c * (longdouble)27.0 + (lVar3 + lVar3) * a + a * (longdouble)-3.0 * lVar8) /
          (longdouble)54.0;
  lVar8 = lVar4 * lVar4 * lVar4;
  if (lVar8 <= lVar3 * lVar3) {
    lVar1 = (longdouble)0;
    lVar6 = -(longdouble)1;
    if (lVar3 <= lVar1 || lVar1 != lVar3) {
      lVar6 = (longdouble)1;
    }
    lVar7 = -lVar1;
    if (lVar3 != lVar1) {
      lVar7 = lVar6;
    }
    if (NAN(lVar3) || NAN(lVar1)) {
      lVar7 = lVar6;
    }
    dVar9 = (double)(lVar3 * lVar3 - lVar8);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar9 = pow((double)(ABS(lVar3) + (longdouble)dVar9),0.3333333333333333);
    lVar7 = lVar7 * (longdouble)dVar9;
    lVar3 = (longdouble)0;
    bVar2 = lVar7 == lVar3;
    if ((lVar7 != lVar3) || (NAN(lVar7) || NAN(lVar3))) {
      lVar5 = (lVar4 / lVar7 + lVar7) - lVar5;
    }
    else {
      lVar5 = -lVar5;
      *r3 = lVar5;
      *r2 = lVar5;
    }
    *r1 = lVar5;
  }
  else {
    dVar9 = (double)lVar4;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar10 = (double)lVar8;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar10 = acos((double)(lVar3 / (longdouble)dVar10));
    dVar10 = dVar10 / 3.0;
    lVar3 = (longdouble)dVar9 * (longdouble)-2.0;
    dVar9 = cos(dVar10);
    *r1 = lVar3 * (longdouble)dVar9 - lVar5;
    dVar9 = cos(dVar10 + 2.0943951023931953);
    *r2 = lVar3 * (longdouble)dVar9 - lVar5;
    dVar9 = cos(dVar10 + -2.0943951023931953);
    *r3 = lVar3 * (longdouble)dVar9 - lVar5;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool MathUtil::RealRootsForCubic(long double const a,
                                 long double const b,
                                 long double const c,
                                 long double *const r1,
                                 long double *const r2,
                                 long double *const r3) {
  // According to Numerical Recipes (pp. 184-5), what
  // follows is an arrangement of computations to
  // compute the roots of a cubic that minimizes
  // roundoff error (as pointed out by A.J. Glassman).

  long double const a_squared = a * a, a_third = a / 3.0, b_tripled = 3.0 * b;
  long double const Q = (a_squared - b_tripled) / 9.0;
  long double const R =
      (2.0 * a_squared * a - 3.0 * a * b_tripled + 27.0 * c) / 54.0;

  long double const R_squared = R * R;
  long double const Q_cubed = Q * Q * Q;

  if (R_squared < Q_cubed) {
    long double const root_Q = sqrt(Q);
    long double const two_pi_third = 2.0 * M_PI / 3.0;
    long double const theta_third = acos(R / sqrt(Q_cubed)) / 3.0;
    long double const minus_two_root_Q = -2.0 * root_Q;

    *r1 = minus_two_root_Q * cos(theta_third) - a_third;
    *r2 = minus_two_root_Q * cos(theta_third + two_pi_third) - a_third;
    *r3 = minus_two_root_Q * cos(theta_third - two_pi_third) - a_third;

    return true;
  }

  long double const A =
    -sgn(R) * pow(std::abs(R) + sqrt(R_squared - Q_cubed), 1.0 / 3.0L);

  if (A != 0.0) {  // in which case, B from NR is zero
    *r1 = A + Q / A - a_third;
    return false;
  }

  *r1 = *r2 = *r3 = -a_third;
  return true;
}